

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPFakeTransmitter::Create
          (RTPFakeTransmitter *this,size_t maximumpacketsize,RTPTransmissionParams *transparams)

{
  bool bVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  TransmissionProtocol TVar4;
  RTPMemoryManager *mgr;
  RTPFakeTransmissionParams *this_00;
  list<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  int status;
  RTPTransmissionParams *transparams_local;
  size_t maximumpacketsize_local;
  RTPFakeTransmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x84;
  }
  else if ((this->created & 1U) == 0) {
    if (transparams == (RTPTransmissionParams *)0x0) {
      mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
      this_00 = (RTPFakeTransmissionParams *)operator_new(0x60,mgr,0);
      RTPFakeTransmissionParams::RTPFakeTransmissionParams(this_00);
      this->params = this_00;
    }
    else {
      TVar4 = RTPTransmissionParams::GetTransmissionProtocol(transparams);
      if (TVar4 != UserDefinedProto) {
        return -0x7d;
      }
      this->params = (RTPFakeTransmissionParams *)transparams;
    }
    __x = RTPFakeTransmissionParams::GetLocalIPList_abi_cxx11_(this->params);
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this->localIPs,__x);
    bVar1 = std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->localIPs);
    if ((!bVar1) || (this_local._4_4_ = CreateLocalIPList(this), -1 < this_local._4_4_)) {
      this->supportsmulticasting = false;
      if (maximumpacketsize < 0x10000) {
        this->maxpacksize = maximumpacketsize;
        uVar3 = RTPFakeTransmissionParams::GetPortbase(this->params);
        this->portbase = uVar3;
        uVar2 = RTPFakeTransmissionParams::GetMulticastTTL(this->params);
        this->multicastTTL = uVar2;
        this->receivemode = AcceptAll;
        this->localhostname = (uint8_t *)0x0;
        this->localhostnamelength = 0;
        this->waitingfordata = false;
        this->created = true;
        this_local._4_4_ = 0;
      }
      else {
        this_local._4_4_ = -0x86;
      }
    }
  }
  else {
    this_local._4_4_ = -0x78;
  }
  return this_local._4_4_;
}

Assistant:

int RTPFakeTransmitter::Create(size_t maximumpacketsize,const RTPTransmissionParams *transparams)
{
//	struct sockaddr_in addr;
//	int status;

	if (!init)
		return ERR_RTP_FAKETRANS_NOTINIT;
	
	MAINMUTEX_LOCK

	if (created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_ALREADYCREATED;
	}
	
	// Obtain transmission parameters
	
	if (transparams == 0)
		params = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) RTPFakeTransmissionParams;
	else
	{
		if (transparams->GetTransmissionProtocol() != RTPTransmitter::UserDefinedProto)
			return ERR_RTP_FAKETRANS_ILLEGALPARAMETERS;
		params = (RTPFakeTransmissionParams *)transparams;
	}

	// Check if portbase is even
	//if (params->GetPortbase()%2 != 0)
	//{
	//	MAINMUTEX_UNLOCK
	//	return ERR_RTP_FAKETRANS_PORTBASENOTEVEN;
	//}

	// Try to obtain local IP addresses

	localIPs = params->GetLocalIPList();
	if (localIPs.empty()) // User did not provide list of local IP addresses, calculate them
	{
		int status;
		
		if ((status = CreateLocalIPList()) < 0)
		{
			MAINMUTEX_UNLOCK
			return status;
		}
#ifdef RTPDEBUG
		std::cout << "Found these local IP addresses:" << std::endl;
		
		std::list<uint32_t>::const_iterator it;

		for (it = localIPs.begin() ; it != localIPs.end() ; it++)
		{
			RTPIPv4Address a(*it);

			std::cout << a.GetAddressString() << std::endl;
		}
#endif // RTPDEBUG
	}

//#ifdef RTP_SUPPORT_IPV4MULTICAST
//	if (SetMulticastTTL(params->GetMulticastTTL()))
//		supportsmulticasting = true;
//	else
//		supportsmulticasting = false;
//#else // no multicast support enabled
	supportsmulticasting = false;
//#endif // RTP_SUPPORT_IPV4MULTICAST

	if (maximumpacketsize > RTPFAKETRANS_MAXPACKSIZE)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_SPECIFIEDSIZETOOBIG;
	}
	
	maxpacksize = maximumpacketsize;
	portbase = params->GetPortbase();
	multicastTTL = params->GetMulticastTTL();
	receivemode = RTPTransmitter::AcceptAll;

	localhostname = 0;
	localhostnamelength = 0;

	waitingfordata = false;
	created = true;

	MAINMUTEX_UNLOCK
	return 0;
}